

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageIntegrityCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  bool bVar1;
  int iVar2;
  u64 uVar3;
  int nByte;
  int nChar;
  int iCol;
  int iPos;
  int rc;
  int ii;
  int bPresent;
  Fts5Termset *pTermset;
  Fts5IntegrityCtx *pCtx;
  int local_28;
  int iUnused2_local;
  int iUnused1_local;
  int nToken_local;
  char *pToken_local;
  void *pvStack_10;
  int tflags_local;
  void *pContext_local;
  
  _ii = *(Fts5Termset **)((long)pContext + 0x18);
  iUnused2_local = nToken;
  if (0x8000 < nToken) {
    iUnused2_local = 0x8000;
  }
  if (((tflags & 1U) == 0) || (*(int *)((long)pContext + 0xc) == 0)) {
    *(int *)((long)pContext + 0xc) = *(int *)((long)pContext + 0xc) + 1;
  }
  iVar2 = *(int *)(*(long *)((long)pContext + 0x20) + 0x5c);
  if (iVar2 == 0) {
    nChar = *(int *)((long)pContext + 0xc) + -1;
    nByte = *(int *)((long)pContext + 8);
  }
  else if (iVar2 == 2) {
    nChar = *(int *)((long)pContext + 8);
    nByte = 0;
  }
  else {
    nChar = 0;
    nByte = 0;
  }
  pTermset = (Fts5Termset *)pContext;
  pCtx._4_4_ = iUnused2;
  local_28 = iUnused1;
  _iUnused1_local = pToken;
  pToken_local._4_4_ = tflags;
  pvStack_10 = pContext;
  iCol = sqlite3Fts5TermsetAdd(_ii,0,pToken,iUnused2_local,&rc);
  if ((iCol == 0) && (rc == 0)) {
    uVar3 = sqlite3Fts5IndexEntryCksum
                      ((i64)pTermset->apHash[0],nByte,nChar,0,_iUnused1_local,iUnused2_local);
    pTermset->apHash[2] = (Fts5TermsetEntry *)(uVar3 ^ (ulong)pTermset->apHash[2]);
  }
  iPos = 0;
  while( true ) {
    bVar1 = false;
    if (iCol == 0) {
      bVar1 = iPos < *(int *)&pTermset->apHash[4][2].pTerm;
    }
    if (!bVar1) break;
    iVar2 = sqlite3Fts5IndexCharlenToBytelen
                      (_iUnused1_local,iUnused2_local,
                       *(int *)(*(long *)&pTermset->apHash[4][2].nTerm + (long)iPos * 4));
    if ((iVar2 != 0) &&
       (iCol = sqlite3Fts5TermsetAdd(_ii,iPos + 1,_iUnused1_local,iVar2,&rc), rc == 0)) {
      uVar3 = sqlite3Fts5IndexEntryCksum
                        ((i64)pTermset->apHash[0],nByte,nChar,iPos + 1,_iUnused1_local,iVar2);
      pTermset->apHash[2] = (Fts5TermsetEntry *)(uVar3 ^ (ulong)pTermset->apHash[2]);
    }
    iPos = iPos + 1;
  }
  return iCol;
}

Assistant:

static int fts5StorageIntegrityCallback(
  void *pContext,                 /* Pointer to Fts5IntegrityCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5IntegrityCtx *pCtx = (Fts5IntegrityCtx*)pContext;
  Fts5Termset *pTermset = pCtx->pTermset;
  int bPresent;
  int ii;
  int rc = SQLITE_OK;
  int iPos;
  int iCol;

  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }

  switch( pCtx->pConfig->eDetail ){
    case FTS5_DETAIL_FULL:
      iPos = pCtx->szCol-1;
      iCol = pCtx->iCol;
      break;

    case FTS5_DETAIL_COLUMNS:
      iPos = pCtx->iCol;
      iCol = 0;
      break;

    default:
      assert( pCtx->pConfig->eDetail==FTS5_DETAIL_NONE );
      iPos = 0;
      iCol = 0;
      break;
  }

  rc = sqlite3Fts5TermsetAdd(pTermset, 0, pToken, nToken, &bPresent);
  if( rc==SQLITE_OK && bPresent==0 ){
    pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
        pCtx->iRowid, iCol, iPos, 0, pToken, nToken
    );
  }

  for(ii=0; rc==SQLITE_OK && ii<pCtx->pConfig->nPrefix; ii++){
    const int nChar = pCtx->pConfig->aPrefix[ii];
    int nByte = sqlite3Fts5IndexCharlenToBytelen(pToken, nToken, nChar);
    if( nByte ){
      rc = sqlite3Fts5TermsetAdd(pTermset, ii+1, pToken, nByte, &bPresent);
      if( bPresent==0 ){
        pCtx->cksum ^= sqlite3Fts5IndexEntryCksum(
            pCtx->iRowid, iCol, iPos, ii+1, pToken, nByte
        );
      }
    }
  }

  return rc;
}